

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

MessageProcessingResult __thiscall helics::FederateState::processDelayQueue(FederateState *this)

{
  pointer pGVar1;
  bool bVar2;
  MessageProcessingResult MVar3;
  _Rb_tree_node_base *p_Var4;
  MessageProcessingResult MVar5;
  ActionMessage *cmd;
  
  pGVar1 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->delayedFederates).
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish != pGVar1) {
    (this->delayedFederates).
    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  MVar5 = CONTINUE_PROCESSING;
  if ((this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var4 = (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->delayQueues)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      cmd = (ActionMessage *)p_Var4[1]._M_right;
      if ((ActionMessage *)p_Var4[2]._M_right == cmd) {
        MVar5 = CONTINUE_PROCESSING;
      }
      else {
        do {
          bVar2 = messageShouldBeDelayed(this,cmd);
          MVar5 = DELAY_MESSAGE;
          if ((!bVar2) && (MVar3 = processActionMessage(this,cmd), MVar3 != DELAY_MESSAGE)) {
            CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
            pop_front((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                      &p_Var4[1]._M_parent);
            MVar5 = MVar3;
          }
        } while ((MVar5 == CONTINUE_PROCESSING) &&
                (cmd = (ActionMessage *)p_Var4[1]._M_right,
                (ActionMessage *)p_Var4[2]._M_right != cmd));
      }
      if (DELAY_MESSAGE < MVar5) {
        return MVar5;
      }
    }
  }
  return MVar5;
}

Assistant:

MessageProcessingResult FederateState::processDelayQueue() noexcept
{
    delayedFederates.clear();
    auto ret_code = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!delayQueues.empty()) {
        for (auto& dqueue : delayQueues) {
            auto& tempQueue = dqueue.second;
            ret_code = MessageProcessingResult::CONTINUE_PROCESSING;
            // we specifically want to stop the loop on a delay_message return
            while ((ret_code == MessageProcessingResult::CONTINUE_PROCESSING) &&
                   (!tempQueue.empty())) {
                auto& cmd = tempQueue.front();
                if (messageShouldBeDelayed(cmd)) {
                    ret_code = MessageProcessingResult::DELAY_MESSAGE;
                    continue;
                }

                ret_code = processActionMessage(cmd);
                if (ret_code == MessageProcessingResult::DELAY_MESSAGE) {
                    continue;
                }
                tempQueue.pop_front();
            }
            if (returnableResult(ret_code)) {
                break;
            }
        }
    }
    return ret_code;
}